

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O0

bool __thiscall mp::NLSuffix::operator<(NLSuffix *this,NLSuffix *s)

{
  byte bVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  
  std::make_pair<std::__cxx11::string_const&,int>
            (in_stack_ffffffffffffff88,
             (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  std::make_pair<std::__cxx11::string_const&,int>
            (in_stack_ffffffffffffff88,
             (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  bVar1 = std::operator<((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                          *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x12bf74);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x12bf7e);
  return (bool)(bVar1 & 1);
}

Assistant:

bool operator<(const NLSuffix& s) const {
    return std::make_pair(name_, kind_&3)
        < std::make_pair(s.name_, s.kind_&3);
  }